

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O2

void __thiscall
KosarajuSCC::KosarajuSCC
          (KosarajuSCC *this,int v,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *out,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *in,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *en)

{
  pointer pvVar1;
  undefined4 in_EAX;
  undefined4 uStack_28;
  value_type_conflict1 local_24;
  
  this->_vptr_KosarajuSCC = (_func_int **)&PTR__KosarajuSCC_001f1968;
  this->nb_nodes = v;
  pvVar1 = (out->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->outgoing).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (out->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->outgoing).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->outgoing).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (out->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (out->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (out->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (out->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (in->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->ingoing).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (in->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->ingoing).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->ingoing).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (in->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (in->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = (en->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->ends).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (en->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->ends).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->ends).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (en->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (en->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (en->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (en->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _uStack_28 = CONCAT44(0xffffffff,in_EAX);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->scc,(long)this->nb_nodes,&local_24,(allocator_type *)((long)&uStack_28 + 3));
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->sccs).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sccs).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sccs).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->level2mandscc)._M_h._M_buckets = &(this->level2mandscc)._M_h._M_single_bucket;
  (this->level2mandscc)._M_h._M_bucket_count = 1;
  (this->level2mandscc)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->level2mandscc)._M_h._M_element_count = 0;
  (this->level2mandscc)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->level2mandscc)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->level2mandscc)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mandscc2somenode)._M_h._M_buckets = &(this->mandscc2somenode)._M_h._M_single_bucket;
  (this->mandscc2somenode)._M_h._M_bucket_count = 1;
  (this->mandscc2somenode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mandscc2somenode)._M_h._M_element_count = 0;
  (this->mandscc2somenode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mandscc2somenode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mandscc2somenode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

KosarajuSCC::KosarajuSCC(int v, std::vector<std::vector<int> > out,
												 std::vector<std::vector<int> > in, std::vector<std::vector<int> > en)
		: nb_nodes(v),
			outgoing(std::move(out)),
			ingoing(std::move(in)),
			ends(std::move(en)),
			scc(nb_nodes, -1) {}